

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCheck.hpp
# Opt level: O1

void FMB::ModelCheck::doCheck(UnitList *units)

{
  Connective CVar1;
  Unit *pUVar2;
  Cell *pCVar3;
  Term *this;
  char cVar4;
  size_t i;
  long lVar5;
  ostream *poVar6;
  Formula *pFVar7;
  Set<Kernel::Term_*,_Lib::DefaultHash> *pSVar8;
  long *plVar9;
  uint *puVar10;
  Entry *pEVar11;
  long *plVar12;
  int *piVar13;
  undefined8 *puVar14;
  long *plVar15;
  int iVar16;
  uint uVar17;
  uint *res;
  List<Kernel::Unit_*> *pLVar18;
  List<Kernel::Unit_*> *pLVar19;
  char *pcVar20;
  ulong uVar21;
  byte bVar22;
  void **head;
  uint uVar23;
  Cell *pCVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  string name_1;
  bool dummy;
  Set<Kernel::Term_*,_Lib::DefaultHash> domainConstants;
  DArray<unsigned_int> sortSizesArray;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> sortSizes;
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> domainConstantNumber;
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  domainConstantsPerSort;
  FiniteModelMultiSorted model;
  string local_298;
  _Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [16];
  undefined1 local_238 [40];
  ulong local_210;
  undefined8 *local_208;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_200;
  long *local_1d8 [2];
  long local_1c8 [2];
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_1b8;
  DArray<unsigned_int> local_190;
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [224];
  
  local_200._timestamp = 1;
  local_200._size = 0;
  local_200._deleted = 0;
  local_200._capacityIndex = 0;
  local_200._capacity = 0;
  local_200._nextExpansionOccupancy = 0;
  local_200._entries._0_4_ = 0;
  local_200._entries._4_4_ = 0;
  local_200._afterLast._0_4_ = 0;
  local_200._afterLast._4_4_ = 0;
  local_178._timestamp = 1;
  local_178._size = 0;
  local_178._deleted = 0;
  local_178._capacityIndex = 0;
  local_178._capacity = 0;
  local_178._20_8_ = 0;
  local_178._28_8_ = 0;
  local_178._afterLast._4_4_ = 0;
  local_238._24_8_ = units;
  if (units != (UnitList *)0x0) {
    do {
      pUVar2 = units->_head;
      units = units->_tail;
      if (((undefined1  [48])pUVar2->_inference & (undefined1  [48])0x1c) == (undefined1  [48])0x18)
      {
        local_110._0_8_ = local_110 + 0x10;
        local_110._8_8_ = 0;
        local_110[0x10] = '\0';
        Parse::TPTP::findAxiomName(pUVar2,(string *)local_110);
        local_248._0_8_ = (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_238;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"finite_domain","");
        lVar5 = std::__cxx11::string::rfind(local_110,local_248._0_8_,0);
        if ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248._0_8_ !=
            (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_238) {
          operator_delete((void *)local_248._0_8_,local_238._0_8_ + 1);
        }
        if (lVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Finite domain axiom found:",0x1a);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          poVar6 = (ostream *)std::ostream::flush();
          Kernel::Unit::toString_abi_cxx11_((string *)local_248,pUVar2);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_248._0_8_,
                              CONCAT44(local_248._12_4_,local_248._8_4_));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248._0_8_ !=
              (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_238) {
            operator_delete((void *)local_248._0_8_,local_238._0_8_ + 1);
          }
          if ((pUVar2->field_0x4 & 1) == 0) {
            puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
            *puVar14 = &PTR_cry_00b69f40;
            puVar14[1] = puVar14 + 3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar14 + 1),"finite_domain in cnf (use fof/tff instead)","");
            *puVar14 = &PTR_cry_00b6a028;
            *(undefined4 *)(puVar14 + 5) = 0;
            puVar14[6] = puVar14 + 8;
            puVar14[7] = 0;
            *(undefined1 *)(puVar14 + 8) = 0;
            __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                        ::Lib::UserErrorException::~UserErrorException);
          }
          pFVar7 = Kernel::Unit::getFormula(pUVar2);
          if (pFVar7->_connective != FORALL) {
            puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
            *puVar14 = &PTR_cry_00b69f40;
            puVar14[1] = puVar14 + 3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar14 + 1),"finite_domain is not a domain axiom","");
            *puVar14 = &PTR_cry_00b6a028;
            *(undefined4 *)(puVar14 + 5) = 0;
            puVar14[6] = puVar14 + 8;
            puVar14[7] = 0;
            *(undefined1 *)(puVar14 + 8) = 0;
            __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                        ::Lib::UserErrorException::~UserErrorException);
          }
          lVar5 = *(long *)(pFVar7 + 1);
          if (lVar5 == 0) {
LAB_001ac60d:
            puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
            *puVar14 = &PTR_cry_00b69f40;
            puVar14[1] = puVar14 + 3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)(puVar14 + 1),
                       "finite_domain must start with forall over a single variable","");
            *puVar14 = &PTR_cry_00b6a028;
            *(undefined4 *)(puVar14 + 5) = 0;
            puVar14[6] = puVar14 + 8;
            puVar14[7] = 0;
            *(undefined1 *)(puVar14 + 8) = 0;
            __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                        ::Lib::UserErrorException::~UserErrorException);
          }
          piVar13 = (int *)pFVar7[1]._label._M_string_length;
          iVar16 = 1;
          do {
            lVar5 = *(long *)(lVar5 + 8);
            iVar16 = iVar16 + -1;
          } while (lVar5 != 0);
          if (iVar16 != 0) goto LAB_001ac60d;
          plVar9 = (long *)pFVar7[1]._label._M_dataplus._M_p;
          if (plVar9 == (long *)0x0) {
            uVar17 = Kernel::Signature::getDefaultSort(DAT_00b7e1b0);
          }
          else {
            uVar17 = *(uint *)(*plVar9 + 8);
          }
          pSVar8 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)
                   ::Lib::FixedSizeAllocator<48UL>::alloc
                             ((FixedSizeAllocator<48UL> *)
                              (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
          pSVar8->_capacity = 0;
          pSVar8->_nonemptyCells = 0;
          pSVar8->_size = 0;
          pSVar8->_entries = (Cell *)0x0;
          ::Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::expand(pSVar8);
          local_1b8._timestamp = 0xffffffff;
          local_248._0_8_ = pSVar8;
          if (*piVar13 == 0) {
            uVar23 = 1;
            checkIsDomainLiteral(*(Literal **)(piVar13 + 10),(int *)&local_1b8,pSVar8);
          }
          else {
            if (*piVar13 != 2) {
              puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
              *puVar14 = &PTR_cry_00b69f40;
              puVar14[1] = puVar14 + 3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(puVar14 + 1),"finite_domain is not a domain axiom","");
              *puVar14 = &PTR_cry_00b6a028;
              *(undefined4 *)(puVar14 + 5) = 0;
              puVar14[6] = puVar14 + 8;
              puVar14[7] = 0;
              *(undefined1 *)(puVar14 + 8) = 0;
              __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                          ::Lib::UserErrorException::~UserErrorException);
            }
            puVar14 = *(undefined8 **)(piVar13 + 10);
            uVar23 = 0;
            while (puVar14 != (undefined8 *)0x0) {
              piVar13 = (int *)*puVar14;
              if (*piVar13 != 0) {
                puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
                *puVar14 = &PTR_cry_00b69f40;
                puVar14[1] = puVar14 + 3;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)(puVar14 + 1),"finite_domain is not a domain axiom","");
                *puVar14 = &PTR_cry_00b6a028;
                *(undefined4 *)(puVar14 + 5) = 0;
                puVar14[6] = puVar14 + 8;
                puVar14[7] = 0;
                *(undefined1 *)(puVar14 + 8) = 0;
                __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                            ::Lib::UserErrorException::~UserErrorException);
              }
              puVar14 = (undefined8 *)puVar14[1];
              uVar23 = uVar23 + 1;
              checkIsDomainLiteral
                        (*(Literal **)(piVar13 + 10),(int *)&local_1b8,
                         (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248._0_8_);
            }
          }
          ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::set
                    (&local_200,uVar17,uVar23);
          local_270._M_head_impl = (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248._0_8_;
          local_248._0_8_ = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
          ::Lib::
          DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
          ::set(&local_178,uVar17,
                (unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                 *)&local_270);
          if (local_270._M_head_impl != (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0) {
            std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>::operator()
                      ((default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *)&local_270,
                       local_270._M_head_impl);
          }
          local_270._M_head_impl = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
          if ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248._0_8_ !=
              (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0) {
            std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>::operator()
                      ((default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_> *)local_248,
                       (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248._0_8_);
          }
        }
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
        }
      }
    } while (units != (List<Kernel::Unit_*> *)0x0);
  }
  if (local_200._size == 0) {
    puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
    *puVar14 = &PTR_cry_00b69f40;
    puVar14[1] = puVar14 + 3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar14 + 1),
               "No domain definition found!\n Use vampire(model_check,model_start). MODEL_DEFINITION_FORMULAS. vampire(model_check,model_end)."
               ,"");
    *puVar14 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar14 + 5) = 0;
    puVar14[6] = puVar14 + 8;
    puVar14[7] = 0;
    *(undefined1 *)(puVar14 + 8) = 0;
    __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Loading model...",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  local_238._32_8_ =
       (ulong)((long)(DAT_00b7e1b0->_typeCons)._cursor - (long)(DAT_00b7e1b0->_typeCons)._stack) >>
       3 & 0xffffffff;
  local_210 = local_238._32_8_;
  if (local_238._32_8_ == 0) {
    local_208 = (undefined8 *)0x0;
  }
  else {
    uVar21 = local_238._32_8_ * 4 + 0xfU & 0x7fffffff0;
    if (uVar21 == 0) {
      local_208 = (undefined8 *)
                  ::Lib::FixedSizeAllocator<8UL>::alloc
                            ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar21 < 0x11) {
      local_208 = (undefined8 *)
                  ::Lib::FixedSizeAllocator<16UL>::alloc
                            ((FixedSizeAllocator<16UL> *)
                             (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar21 < 0x19) {
      local_208 = (undefined8 *)
                  ::Lib::FixedSizeAllocator<24UL>::alloc
                            ((FixedSizeAllocator<24UL> *)
                             (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar21 < 0x21) {
      local_208 = (undefined8 *)
                  ::Lib::FixedSizeAllocator<32UL>::alloc
                            ((FixedSizeAllocator<32UL> *)
                             (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar21 < 0x31) {
      local_208 = (undefined8 *)
                  ::Lib::FixedSizeAllocator<48UL>::alloc
                            ((FixedSizeAllocator<48UL> *)
                             (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar21 < 0x41) {
      local_208 = (undefined8 *)
                  ::Lib::FixedSizeAllocator<64UL>::alloc
                            ((FixedSizeAllocator<64UL> *)
                             (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_208 = (undefined8 *)::operator_new(uVar21,0x10);
    }
    if (local_210 != 0) {
      memset(local_208,0,local_210 << 2);
    }
  }
  plVar9 = (long *)::operator_new(0x28);
  *(undefined4 *)(plVar9 + 1) = 0;
  *plVar9 = (long)&PTR__IteratorCore_00b4c7f8;
  *(undefined4 *)(plVar9 + 2) = local_200._entries._0_4_;
  *(undefined4 *)((long)plVar9 + 0x14) = local_200._entries._4_4_;
  *(undefined4 *)(plVar9 + 3) = local_200._afterLast._0_4_;
  *(undefined4 *)((long)plVar9 + 0x1c) = local_200._afterLast._4_4_;
  *(uint *)(plVar9 + 4) = local_200._timestamp;
  *(undefined4 *)(plVar9 + 1) = 1;
  while (cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9), cVar4 != '\0') {
    auVar26 = (**(code **)(*plVar9 + 0x18))(plVar9);
    *(undefined4 *)((long)local_208 + (ulong)*auVar26._0_8_ * 4) = *auVar26._8_8_;
  }
  plVar12 = plVar9 + 1;
  *(int *)plVar12 = (int)*plVar12 + -1;
  if ((int)*plVar12 == 0) {
    (**(code **)(*plVar9 + 8))(plVar9);
  }
  ::Lib::DArray<unsigned_int>::DArray(&local_190,(DArray<unsigned_int> *)(local_238 + 0x20));
  FiniteModelMultiSorted::FiniteModelMultiSorted((FiniteModelMultiSorted *)local_110,&local_190);
  if (local_190._array != (uint *)0x0) {
    uVar21 = local_190._capacity * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar21 == 0) {
      *(undefined8 *)local_190._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_190._array;
    }
    else if (uVar21 < 0x11) {
      *(undefined8 *)local_190._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_190._array;
    }
    else if (uVar21 < 0x19) {
      *(undefined8 *)local_190._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_190._array;
    }
    else if (uVar21 < 0x21) {
      *(undefined8 *)local_190._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_190._array;
    }
    else if (uVar21 < 0x31) {
      *(undefined8 *)local_190._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_190._array;
    }
    else if (uVar21 < 0x41) {
      *(undefined8 *)local_190._array = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_190._array;
    }
    else {
      operator_delete(local_190._array,0x10);
    }
  }
  local_248._0_8_ = (pointer)0x0;
  local_248._8_4_ = 0;
  local_238._0_8_ = (undefined8 *)0x0;
  ::Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::expand
            ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248);
  local_1b8._timestamp = 1;
  local_1b8._size = 0;
  local_1b8._deleted = 0;
  local_1b8._capacityIndex = 0;
  local_1b8._capacity = 0;
  local_1b8._20_8_ = 0;
  local_1b8._28_8_ = 0;
  local_1b8._afterLast._4_4_ = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Detected model with ",0x14);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," sorts.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  plVar9 = (long *)::operator_new(0x28);
  *(undefined4 *)(plVar9 + 1) = 0;
  *plVar9 = (long)&PTR__IteratorCore_00b4c7f8;
  plVar9[2] = CONCAT44(local_200._entries._4_4_,local_200._entries._0_4_);
  plVar9[3] = CONCAT44(local_200._afterLast._4_4_,local_200._afterLast._0_4_);
  *(uint *)(plVar9 + 4) = local_200._timestamp;
  *(undefined4 *)(plVar9 + 1) = 1;
LAB_001abb4f:
  cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9);
  if (cVar4 == '\0') {
    pLVar19 = (List<Kernel::Unit_*> *)local_238._24_8_;
    if ((UnitList *)local_238._24_8_ != (UnitList *)0x0) {
      pLVar18 = (List<Kernel::Unit_*> *)local_238._24_8_;
      do {
        pUVar2 = pLVar18->_head;
        pLVar18 = pLVar18->_tail;
        if (((undefined1  [48])pUVar2->_inference & (undefined1  [48])0x1c) ==
            (undefined1  [48])0x18) {
          local_298._M_string_length = 0;
          local_298.field_2._M_allocated_capacity =
               local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          Parse::TPTP::findAxiomName(pUVar2,&local_298);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"finite_domain","");
          lVar5 = std::__cxx11::string::rfind
                            ((char *)&local_298,(ulong)local_268._M_dataplus._M_p,0);
          if (lVar5 == 0) {
            bVar25 = true;
            pLVar19 = (List<Kernel::Unit_*> *)local_238._24_8_;
          }
          else {
            local_1d8[0] = local_1c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1d8,"distinct_domain","");
            lVar5 = std::__cxx11::string::rfind((char *)&local_298,(ulong)local_1d8[0],0);
            pLVar19 = (List<Kernel::Unit_*> *)local_238._24_8_;
            bVar25 = lVar5 == 0;
            if (local_1d8[0] != local_1c8) {
              operator_delete(local_1d8[0],local_1c8[0] + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if (!bVar25) {
            if ((pUVar2->field_0x4 & 1) == 0) {
              puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
              *puVar14 = &PTR_cry_00b69f40;
              puVar14[1] = puVar14 + 3;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(puVar14 + 1),"Expecting model to use formulas i.e. fof/tff","");
              *puVar14 = &PTR_cry_00b6a028;
              *(undefined4 *)(puVar14 + 5) = 0;
              puVar14[6] = puVar14 + 8;
              puVar14[7] = 0;
              *(undefined1 *)(puVar14 + 8) = 0;
              __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                          ::Lib::UserErrorException::~UserErrorException);
            }
            pFVar7 = Kernel::Unit::getFormula(pUVar2);
            CVar1 = pFVar7->_connective;
            if (CVar1 == LITERAL) {
              addDefinition((FiniteModelMultiSorted *)local_110,*(Literal **)(pFVar7 + 1),false,
                            (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248,&local_1b8);
            }
            else if (CVar1 == AND) {
              puVar14 = *(undefined8 **)(pFVar7 + 1);
              while (puVar14 != (undefined8 *)0x0) {
                piVar13 = (int *)*puVar14;
                iVar16 = *piVar13;
                if (iVar16 == 6) {
                  piVar13 = *(int **)(piVar13 + 10);
                }
                if (*piVar13 != 0) {
                  puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
                  *puVar14 = &PTR_cry_00b69f40;
                  puVar14[1] = puVar14 + 3;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)(puVar14 + 1),"Badly formed definition","");
                  *puVar14 = &PTR_cry_00b6a028;
                  *(undefined4 *)(puVar14 + 5) = 0;
                  puVar14[6] = puVar14 + 8;
                  puVar14[7] = 0;
                  *(undefined1 *)(puVar14 + 8) = 0;
                  __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                              ::Lib::UserErrorException::~UserErrorException);
                }
                puVar14 = (undefined8 *)puVar14[1];
                addDefinition((FiniteModelMultiSorted *)local_110,*(Literal **)(piVar13 + 10),
                              iVar16 == 6,(Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248,
                              &local_1b8);
              }
            }
            else {
              if (CVar1 != NOT) {
                puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
                Kernel::Formula::toString_abi_cxx11_(&local_268,pFVar7);
                std::operator+(&local_150,"Expecting conjunction of definitions in model:\n",
                               &local_268);
                *puVar14 = &PTR_cry_00b69f40;
                puVar14[1] = puVar14 + 3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(puVar14 + 1),local_150._M_dataplus._M_p,
                           local_150._M_dataplus._M_p + local_150._M_string_length);
                *puVar14 = &PTR_cry_00b6a028;
                *(undefined4 *)(puVar14 + 5) = 0;
                puVar14[6] = puVar14 + 8;
                puVar14[7] = 0;
                *(undefined1 *)(puVar14 + 8) = 0;
                __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                            ::Lib::UserErrorException::~UserErrorException);
              }
              if (**(int **)(pFVar7 + 1) != 0) {
                puVar14 = (undefined8 *)__cxa_allocate_exception(0x50);
                Kernel::Formula::toString_abi_cxx11_(&local_268,pFVar7);
                std::operator+(&local_130,"Unexpected negation in ",&local_268);
                *puVar14 = &PTR_cry_00b69f40;
                puVar14[1] = puVar14 + 3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(puVar14 + 1),local_130._M_dataplus._M_p,
                           local_130._M_dataplus._M_p + local_130._M_string_length);
                *puVar14 = &PTR_cry_00b6a028;
                *(undefined4 *)(puVar14 + 5) = 0;
                puVar14[6] = puVar14 + 8;
                puVar14[7] = 0;
                *(undefined1 *)(puVar14 + 8) = 0;
                __cxa_throw(puVar14,&::Lib::UserErrorException::typeinfo,
                            ::Lib::UserErrorException::~UserErrorException);
              }
              addDefinition((FiniteModelMultiSorted *)local_110,
                            *(Literal **)(*(int **)(pFVar7 + 1) + 10),true,
                            (Set<Kernel::Term_*,_Lib::DefaultHash> *)local_248,&local_1b8);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
        }
      } while (pLVar18 != (List<Kernel::Unit_*> *)0x0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Model loaded",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Checking formulas...",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (pLVar19 == (UnitList *)0x0) {
      lVar5 = 0x1f;
      pcVar20 = "All formulas evaluated to True!";
    }
    else {
      bVar22 = 1;
      do {
        pUVar2 = pLVar19->_head;
        pLVar19 = pLVar19->_tail;
        if (((undefined1  [48])pUVar2->_inference & (undefined1  [48])0x1c) !=
            (undefined1  [48])0x18) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Checking ",9);
          Kernel::Unit::toString_abi_cxx11_(&local_298,pUVar2);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_298._M_dataplus._M_p,
                              local_298._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"...",3);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          bVar25 = FiniteModelMultiSorted::evaluate((FiniteModelMultiSorted *)local_110,pUVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Evaluates to ",0xd);
          pcVar20 = "False";
          if (bVar25) {
            pcVar20 = "True";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,pcVar20,(ulong)bVar25 ^ 5);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
          bVar22 = bVar22 & bVar25;
        }
      } while (pLVar19 != (List<Kernel::Unit_*> *)0x0);
      pcVar20 = "There was a false formula!";
      if (bVar22 != 0) {
        pcVar20 = "All formulas evaluated to True!";
      }
      lVar5 = (ulong)bVar22 * 5 + 0x1a;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    plVar12 = plVar9 + 1;
    *(int *)plVar12 = (int)*plVar12 + -1;
    if ((int)*plVar12 == 0) {
      (**(code **)(*plVar9 + 8))(plVar9);
    }
    ::Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_1b8);
    if ((undefined8 *)local_238._0_8_ != (undefined8 *)0x0) {
      if ((long)(int)local_248._0_4_ == 0) {
        *(undefined8 *)local_238._0_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_238._0_8_;
      }
      else {
        uVar21 = (long)(int)local_248._0_4_ * 0x10;
        if (uVar21 < 0x11) {
          *(undefined8 *)local_238._0_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_238._0_8_;
        }
        else if (uVar21 < 0x19) {
          *(undefined8 *)local_238._0_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_238._0_8_;
        }
        else if (uVar21 < 0x21) {
          *(undefined8 *)local_238._0_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_238._0_8_;
        }
        else if (uVar21 < 0x31) {
          *(undefined8 *)local_238._0_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_238._0_8_;
        }
        else if (uVar21 < 0x41) {
          *(undefined8 *)local_238._0_8_ = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_238._0_8_;
        }
        else {
          operator_delete((void *)local_238._0_8_,0x10);
        }
      }
    }
    FiniteModelMultiSorted::~FiniteModelMultiSorted((FiniteModelMultiSorted *)local_110);
    if (local_208 != (undefined8 *)0x0) {
      uVar21 = local_210 * 4 + 0xf & 0xfffffffffffffff0;
      if (uVar21 == 0) {
        *local_208 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_208;
      }
      else if (uVar21 < 0x11) {
        *local_208 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_208;
      }
      else if (uVar21 < 0x19) {
        *local_208 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_208;
      }
      else if (uVar21 < 0x21) {
        *local_208 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_208;
      }
      else if (uVar21 < 0x31) {
        *local_208 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_208;
      }
      else if (uVar21 < 0x41) {
        *local_208 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_208;
      }
      else {
        operator_delete(local_208,0x10);
      }
    }
    ::Lib::
    DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::~DHMap(&local_178);
    ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&local_200);
    return;
  }
  puVar10 = (uint *)(**(code **)(*plVar9 + 0x18))(plVar9);
  local_298._M_dataplus._M_p._0_4_ = *puVar10;
  pEVar11 = ::Lib::
            DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::findEntry(&local_178,(uint *)&local_298);
  pSVar8 = (pEVar11->_val)._M_t.
           super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
           .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl;
  std::operator+(&local_268,"  domain for ",&(DAT_00b7e1b0->_typeCons)._stack[*puVar10]->_name);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  plVar15 = plVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar15) {
    local_298.field_2._M_allocated_capacity = *plVar15;
    local_298.field_2._8_8_ = plVar12[3];
  }
  else {
    local_298.field_2._M_allocated_capacity = *plVar15;
    local_298._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_298._M_string_length = plVar12[1];
  *plVar12 = (long)plVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,", domain elements are:",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  pCVar24 = pSVar8->_entries;
  pCVar3 = pSVar8->_afterLast;
  uVar17 = 1;
  do {
    bVar25 = pCVar24 != pCVar3;
    if (bVar25) {
      uVar23 = pCVar24->code;
      while (uVar23 < 2) {
        pCVar24 = pCVar24 + 1;
        bVar25 = pCVar24 != pCVar3;
        if (pCVar24 == pCVar3) break;
        uVar23 = pCVar24->code;
      }
    }
    if (!bVar25) goto LAB_001abb4f;
    this = pCVar24->value;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    Kernel::Term::toString_abi_cxx11_(&local_298,this,true);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_298._M_dataplus._M_p,local_298._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    pCVar24 = pCVar24 + 1;
    local_298._M_dataplus._M_p = (pointer)this;
    uVar23 = 0x811c9dc5;
    lVar5 = 0;
    do {
      uVar23 = (*(byte *)((long)&local_298._M_dataplus._M_p + lVar5) ^ uVar23) * 0x1000193;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    ::Lib::Set<Kernel::Term*,Lib::DefaultHash>::
    rawFindOrInsert<Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::Term*,Lib::DefaultHash>::insert(Kernel::Term*,unsigned_int)::_lambda(auto:1)_1_>
              ((Set<Kernel::Term*,Lib::DefaultHash> *)local_248,(anon_class_8_1_ba1d8281)&local_298,
               uVar23,(anon_class_8_1_ba1d8281)&local_298,(bool *)&local_268);
    ::Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (&local_1b8,this,uVar17);
    local_298._M_dataplus._M_p = (pointer)0x0;
    local_298._M_string_length = 0;
    local_298.field_2._M_allocated_capacity = 0;
    FiniteModelMultiSorted::addFunctionDefinition
              ((FiniteModelMultiSorted *)local_110,this->_functor,(DArray<unsigned_int> *)&local_298
               ,uVar17);
    if ((undefined8 *)local_298.field_2._M_allocated_capacity != (undefined8 *)0x0) {
      uVar21 = local_298._M_string_length * 4 + 0xf & 0xfffffffffffffff0;
      if (uVar21 == 0) {
        *(undefined8 *)local_298.field_2._M_allocated_capacity =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_298.field_2._M_allocated_capacity;
      }
      else if (uVar21 < 0x11) {
        *(undefined8 *)local_298.field_2._M_allocated_capacity =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_298.field_2._M_allocated_capacity;
      }
      else if (uVar21 < 0x19) {
        *(undefined8 *)local_298.field_2._M_allocated_capacity =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_298.field_2._M_allocated_capacity;
      }
      else if (uVar21 < 0x21) {
        *(undefined8 *)local_298.field_2._M_allocated_capacity =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_298.field_2._M_allocated_capacity;
      }
      else if (uVar21 < 0x31) {
        *(undefined8 *)local_298.field_2._M_allocated_capacity =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_298.field_2._M_allocated_capacity;
      }
      else if (uVar21 < 0x41) {
        *(undefined8 *)local_298.field_2._M_allocated_capacity =
             ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_298.field_2._M_allocated_capacity;
      }
      else {
        operator_delete((void *)local_298.field_2._M_allocated_capacity,0x10);
      }
    }
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

static void doCheck(UnitList* units)
{
  // find model size
  // looking for a domain axiom with a name starting 'finite_domain' (TODO search for something of the right shape)

  DHMap<unsigned,unsigned> sortSizes;
  DHMap<unsigned,std::unique_ptr<Set<Term*>>> domainConstantsPerSort;

  // first just search for finite_domain axiom (TODO: do this for every sort!)
  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain")){
        std::cout << "Finite domain axiom found:" << std::endl << u->toString() << std::endl;
        // Set model size and domainConstants
        // And check it is a finite domain axiom
        if(u->isClause()) USER_ERROR("finite_domain in cnf (use fof/tff instead)");

        Formula* formula = u->getFormula();
        if(formula->connective()!=Connective::FORALL) USER_ERROR("finite_domain is not a domain axiom");
        Formula* subformula = formula->qarg();

        if (VList::length(formula->vars()) != 1) USER_ERROR("finite_domain must start with forall over a single variable");
        unsigned curSort = (formula->sorts()) ? formula->sorts()->head().term()->functor() : env.signature->getDefaultSort();

        unsigned curModelSize = 0;
        auto curDomainConstants = std::make_unique<Set<Term*>>();

        int single_var = -1;
        if (subformula->connective()==Connective::OR) {
          FormulaList* args = subformula->args();
          FormulaList::Iterator fit(args);
          while(fit.hasNext()){
            curModelSize++;
            Formula* arg = fit.next();
            if(arg->connective()!=Connective::LITERAL) USER_ERROR("finite_domain is not a domain axiom");
            Literal* l = arg->literal();
            checkIsDomainLiteral(l,single_var,*curDomainConstants);
          }
        } else if (subformula->connective()==Connective::LITERAL) {
          curModelSize = 1;
          checkIsDomainLiteral(subformula->literal(),single_var,*curDomainConstants);
        } else USER_ERROR("finite_domain is not a domain axiom");

        sortSizes.set(curSort,curModelSize);
        domainConstantsPerSort.set(curSort,std::move(curDomainConstants));
      }
    }
  }

  if (sortSizes.size() == 0) {
    USER_ERROR("No domain definition found!\n Use vampire(model_check,model_start). MODEL_DEFINITION_FORMULAS. vampire(model_check,model_end).");
  }

  std::cout << "Loading model..." << std::endl;
  DArray<unsigned> sortSizesArray(env.signature->typeCons());
  {
    auto it = sortSizes.items();
    while (it.hasNext()) {
      auto [sort,curModelSize] = it.next();
      sortSizesArray[sort] = curModelSize;
    }
  }
  // TODO can we pass a reference here instead of clone()ing?
  FiniteModelMultiSorted model(sortSizesArray.clone());

  Set<Term*> domainConstants; // union of all the perSort ones
  DHMap<Term*,unsigned> domainConstantNumber;

  std::cout << "Detected model with " << sortSizes.size() << " sorts." << std::endl;
  auto it = sortSizes.items();
  while (it.hasNext()) {
    auto [sort,curModelSize] = it.next();
    auto& curDomainConstants = *domainConstantsPerSort.get(sort);
    ASS_EQ(curModelSize,(unsigned)curDomainConstants.size());

    std::cout << "  domain for " + env.signature->getTypeCon(sort)->name() + " of size " << curModelSize;
    std::cout << ", domain elements are:" << std::endl;

    // number the domain constants
    Set<Term*>::Iterator dit(curDomainConstants);
    unsigned count=1;
    while(dit.hasNext()){
      Term* con = dit.next();
      std::cout << "    " << con->toString() << std::endl;
      domainConstants.insert(con);
      domainConstantNumber.insert(con,count);
      model.addFunctionDefinition(con->functor(),DArray<unsigned>(0),count);
      count++;
    }
  }

  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain") || StringUtils::starts_with(name,"distinct_domain")) continue;

      // All model formulas should be conjunctions of definitions
      // TODO allow for unit clause definitions in the future
      if(u->isClause()) USER_ERROR("Expecting model to use formulas i.e. fof/tff");
      Formula* formula = u->getFormula();

      if(formula->connective()==Connective::NOT){
        Formula* inner = formula->uarg();
        if(inner->connective()==Connective::LITERAL){
          addDefinition(model,inner->literal(),true,domainConstants,domainConstantNumber);
        }
        else USER_ERROR("Unexpected negation in "+formula->toString());
      }
      else if(formula->connective()==Connective::LITERAL){
        addDefinition(model,formula->literal(),false,domainConstants,domainConstantNumber);
      }
      else{
        if(formula->connective()!=Connective::AND)
          USER_ERROR("Expecting conjunction of definitions in model:\n"+formula->toString());
        FormulaList* defs = formula->args();
        FormulaList::Iterator fit(defs);
        while(fit.hasNext()){
          unsigned negated = false;
          Formula* def = fit.next();
          if(def->connective()==Connective::NOT){
            def = def->uarg();
            negated=true;
          }
          if(def->connective()!=Connective::LITERAL) USER_ERROR("Badly formed definition");
          Literal* lit = def->literal();
          addDefinition(model,lit,negated,domainConstants,domainConstantNumber);
        }
      }
    }
    std::cout << "Model loaded" << std::endl;
    std::cout << "Checking formulas..." << std::endl;
    {
      bool allTrue = true;
      UnitList::Iterator uit(units);
      while(uit.hasNext()){
        Unit* u = uit.next();
        if(u->inputType()== UnitInputType::MODEL_DEFINITION) continue;

        std::cout << "Checking " << u->toString() << "..." << std::endl;
        bool res = model.evaluate(u);
        allTrue &= res;
        std::cout << "Evaluates to " << (res ? "True" : "False") << std::endl;
      }
      if (allTrue) {
        std::cout << "All formulas evaluated to True!" << std::endl;
      } else {
        std::cout << "There was a false formula!" << std::endl;
      }
    }
  }
}